

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O3

void nsvg__roundCap(NSVGrasterizer *r,NSVGpoint *left,NSVGpoint *right,NSVGpoint *p,float dx,
                   float dy,float lineWidth,int ncap,int connect)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float x0;
  float x1;
  float in_XMM3_Da;
  float fVar7;
  float y1;
  float in_XMM4_Da;
  float y0;
  float y1_00;
  float fVar8;
  float x1_00;
  
  iVar1 = (int)p;
  if (iVar1 < 1) {
    fVar5 = 0.0;
    fVar4 = 0.0;
    y1 = 0.0;
    x1_00 = 0.0;
  }
  else {
    iVar2 = 0;
    fVar3 = 0.0;
    fVar6 = 0.0;
    x0 = 0.0;
    fVar7 = 0.0;
    y0 = 0.0;
    fVar8 = 0.0;
    do {
      fVar4 = ((float)iVar2 / (float)(iVar1 + -1)) * 3.1415927;
      fVar5 = cosf(fVar4);
      fVar5 = fVar5 * in_XMM4_Da * 0.5;
      fVar4 = sinf(fVar4);
      fVar4 = fVar4 * in_XMM4_Da * 0.5;
      x1 = -lineWidth * fVar4 + -in_XMM3_Da * fVar5 + dx;
      y1_00 = fVar4 * -in_XMM3_Da + fVar5 * lineWidth + dy;
      fVar4 = fVar3;
      fVar5 = fVar6;
      y1 = y1_00;
      x1_00 = x1;
      if ((iVar2 != 0) &&
         (nsvg__addEdge(r,x0,y0,x1,y1_00), fVar4 = x1, fVar5 = y1_00, y1 = fVar7, x1_00 = fVar8,
         iVar2 - iVar1 != -1)) {
        fVar4 = fVar3;
        fVar5 = fVar6;
      }
      iVar2 = iVar2 + 1;
      fVar3 = fVar4;
      fVar6 = fVar5;
      x0 = x1;
      fVar7 = y1;
      y0 = y1_00;
      fVar8 = x1_00;
    } while (iVar2 != iVar1);
  }
  if (ncap != 0) {
    nsvg__addEdge(r,left->x,left->y,x1_00,y1);
    nsvg__addEdge(r,fVar4,fVar5,right->x,right->y);
  }
  left->x = x1_00;
  left->y = y1;
  right->x = fVar4;
  right->y = fVar5;
  return;
}

Assistant:

static void nsvg__roundCap(NSVGrasterizer* r, NSVGpoint* left, NSVGpoint* right, NSVGpoint* p, float dx, float dy, float lineWidth, int ncap, int connect)
{
	int i;
	float w = lineWidth * 0.5f;
	float px = p->x, py = p->y;
	float dlx = dy, dly = -dx;
	float lx = 0, ly = 0, rx = 0, ry = 0, prevx = 0, prevy = 0;

	for (i = 0; i < ncap; i++) {
		float a = (float)i/(float)(ncap-1)*NSVG_PI;
		float ax = cosf(a) * w, ay = sinf(a) * w;
		float x = px - dlx*ax - dx*ay;
		float y = py - dly*ax - dy*ay;

		if (i > 0)
			nsvg__addEdge(r, prevx, prevy, x, y);

		prevx = x;
		prevy = y;

		if (i == 0) {
			lx = x; ly = y;
		} else if (i == ncap-1) {
			rx = x; ry = y;
		}
	}

	if (connect) {
		nsvg__addEdge(r, left->x, left->y, lx, ly);
		nsvg__addEdge(r, rx, ry, right->x, right->y);
	}

	left->x = lx; left->y = ly;
	right->x = rx; right->y = ry;
}